

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::unrecognizedExpressionToken(SelectionCompiler *this)

{
  bool bVar1;
  any tmp;
  string tokenStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined1 local_28 [16];
  
  valuePeek((SelectionCompiler *)local_48);
  local_38._M_allocated_capacity = (size_type)(local_48 + 0x20);
  local_38._8_8_ = 0;
  local_28[0] = 0;
  std::any_cast<std::__cxx11::string>(&local_68,(any *)local_48);
  std::__cxx11::string::operator=((string *)(local_48 + 0x10),(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_68,"unrecognized expression token:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_48 + 0x10));
  bVar1 = compileError(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::any::reset((any *)local_48);
  return bVar1;
}

Assistant:

bool unrecognizedExpressionToken() {
      std::any tmp = valuePeek();
      std::string tokenStr;

      try {
        tokenStr = std::any_cast<std::string>(tmp);
      } catch (const std::bad_any_cast&) {
        return compileError("any_cast error");
      }

      return compileError("unrecognized expression token:" + tokenStr);
    }